

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O2

void __thiscall
websocketpp::connection<websocketpp::config::asio>::process_control_frame
          (connection<websocketpp::config::asio> *this,message_ptr *msg)

{
  value vVar1;
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *pbVar2;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
  *this_00;
  basic<websocketpp::concurrency::basic,_websocketpp::log::elevel> *this_01;
  bool bVar3;
  value vVar4;
  error_category *peVar5;
  ostream *poVar6;
  size_t in_RCX;
  char *__buf;
  int __fd;
  error_code eVar7;
  allocator local_249;
  error_code local_248;
  string local_238;
  __weak_ptr<void,_(__gnu_cxx::_Lock_policy)2> local_218;
  __weak_ptr<void,_(__gnu_cxx::_Lock_policy)2> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream s;
  ostream local_1a8 [8];
  string local_1a0 [368];
  
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            ((this->m_alog).
             super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,0x400,"process_control_frame",in_RCX);
  vVar1 = ((msg->
           super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr)->m_opcode;
  local_248._M_value = 0;
  peVar5 = (error_category *)std::_V2::system_category();
  local_248._M_cat = peVar5;
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  poVar6 = std::operator<<(local_1a8,"Control frame received with opcode ");
  std::ostream::operator<<(poVar6,vVar1);
  pbVar2 = (this->m_alog).
           super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__cxx11::stringbuf::str();
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            (pbVar2,4,&local_238,in_RCX);
  std::__cxx11::string::~string((string *)&local_238);
  __fd = 8;
  if (this->m_state == closed) {
    __buf = "got frame in state closed";
  }
  else {
    in_RCX = CONCAT71((int7)(in_RCX >> 8),vVar1 != CLOSE);
    if (vVar1 != CLOSE && this->m_state != open) {
      __buf = "got non-close frame in state closing";
    }
    else {
      __fd = 1;
      if (vVar1 == CLOSE) {
        log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                  ((this->m_alog).
                   super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,0x400,"got close frame",in_RCX);
        vVar4 = websocketpp::close::extract_code
                          (&((msg->
                             super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->m_payload,&local_248);
        this->m_remote_close_code = vVar4;
        if (local_248._M_value == 0) {
          websocketpp::close::extract_reason
                    (&local_238,
                     &((msg->
                       super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->m_payload,&local_248);
          std::__cxx11::string::operator=
                    ((string *)&this->m_remote_close_reason,(string *)&local_238);
          std::__cxx11::string::~string((string *)&local_238);
          if (local_248._M_value == 0) {
            __buf = "Got close frame in wrong state";
            if (this->m_state == closing) {
              if (this->m_was_clean == false) {
                log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                          ((this->m_alog).
                           super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,0x400,"Got acknowledgement of close",in_RCX);
                this->m_was_clean = true;
                if (this->m_is_server == true) {
                  local_238._M_dataplus._M_p = local_238._M_dataplus._M_p & 0xffffffff00000000;
                  local_238._M_string_length = (size_type)peVar5;
                  terminate(this,(error_code *)&local_238);
                }
                goto LAB_001b140e;
              }
            }
            else if (this->m_state == open) {
              std::__cxx11::string::string((string *)&local_238,"",&local_249);
              std::__cxx11::stringbuf::str(local_1a0);
              std::__cxx11::string::~string((string *)&local_238);
              poVar6 = std::operator<<(local_1a8,"Received close frame with code ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->m_remote_close_code);
              poVar6 = std::operator<<(poVar6," and reason ");
              std::operator<<(poVar6,(string *)&this->m_remote_close_reason);
              pbVar2 = (this->m_alog).
                       super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              std::__cxx11::stringbuf::str();
              log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                        (pbVar2,0x400,&local_238,in_RCX);
              std::__cxx11::string::~string((string *)&local_238);
              local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
              local_238._M_string_length = 0;
              local_238.field_2._M_local_buf[0] = '\0';
              eVar7 = send_close_ack(this,0,&local_238);
              goto LAB_001b1620;
            }
            goto LAB_001b1400;
          }
          log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
                    ((this->m_elog).
                     super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,1,"Received invalid close reason. Sending acknowledgement and closing",
                     in_RCX);
          std::__cxx11::string::string((string *)&local_238,"Invalid close reason",&local_249);
          eVar7 = send_close_ack(this,0x3ea,&local_238);
        }
        else {
          std::__cxx11::string::string((string *)&local_238,"",&local_249);
          std::__cxx11::stringbuf::str(local_1a0);
          std::__cxx11::string::~string((string *)&local_238);
          poVar6 = std::operator<<(local_1a8,"Received invalid close code ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->m_remote_close_code);
          std::operator<<(poVar6," sending acknowledgement and closing");
          this_01 = (this->m_elog).
                    super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          std::__cxx11::stringbuf::str();
          log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
                    (this_01,1,&local_238,in_RCX);
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::string::string((string *)&local_238,"Invalid close code",&local_249);
          eVar7 = send_close_ack(this,0x3ea,&local_238);
        }
LAB_001b1620:
        local_248._M_cat = eVar7._M_cat;
        local_248._M_value = eVar7._M_value;
        std::__cxx11::string::~string((string *)&local_238);
        if (local_248._M_value != 0) {
          log_err<std::error_code>(this,1,"send_close_ack",&local_248);
        }
        goto LAB_001b140e;
      }
      if (vVar1 == PONG) {
        if ((this->m_pong_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
          std::__weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                    (&local_218,
                     &(this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
          std::__cxx11::string::string
                    ((string *)&local_1f8,
                     (string *)
                     &((msg->
                       super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->m_payload);
          std::
          function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          ::operator()(&this->m_pong_handler,(weak_ptr<void> *)&local_218,&local_1f8);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_218._M_refcount);
        }
        this_00 = (this->m_ping_timer).
                  super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        if (this_00 !=
            (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
             *)0x0) {
          asio::
          basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
          ::cancel(this_00);
        }
        goto LAB_001b140e;
      }
      if (vVar1 == PING) {
        if ((this->m_ping_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
          std::__weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                    (&local_208,
                     &(this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
          std::__cxx11::string::string
                    ((string *)&local_1d8,
                     (string *)
                     &((msg->
                       super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->m_payload);
          bVar3 = std::
                  function<bool_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  ::operator()(&this->m_ping_handler,(weak_ptr<void> *)&local_208,&local_1d8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_208._M_refcount);
          if (!bVar3) goto LAB_001b140e;
        }
        pong(this,&((msg->
                    super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->m_payload,&local_248);
        if (local_248._M_value != 0) {
          log_err<std::error_code>(this,1,"Failed to send response pong",&local_248);
        }
        goto LAB_001b140e;
      }
      __buf = "Got control frame with invalid opcode";
    }
  }
LAB_001b1400:
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
            ((this->m_elog).
             super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,__fd,__buf,in_RCX);
LAB_001b140e:
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return;
}

Assistant:

void connection<config>::process_control_frame(typename config::message_type::ptr msg)
{
    m_alog->write(log::alevel::devel,"process_control_frame");

    frame::opcode::value op = msg->get_opcode();
    lib::error_code ec;

    std::stringstream s;
    s << "Control frame received with opcode " << op;
    m_alog->write(log::alevel::control,s.str());

    if (m_state == session::state::closed) {
        m_elog->write(log::elevel::warn,"got frame in state closed");
        return;
    }
    if (op != frame::opcode::CLOSE && m_state != session::state::open) {
        m_elog->write(log::elevel::warn,"got non-close frame in state closing");
        return;
    }

    if (op == frame::opcode::PING) {
        bool should_reply = true;

        if (m_ping_handler) {
            should_reply = m_ping_handler(m_connection_hdl, msg->get_payload());
        }

        if (should_reply) {
            this->pong(msg->get_payload(),ec);
            if (ec) {
                log_err(log::elevel::devel,"Failed to send response pong",ec);
            }
        }
    } else if (op == frame::opcode::PONG) {
        if (m_pong_handler) {
            m_pong_handler(m_connection_hdl, msg->get_payload());
        }
        if (m_ping_timer) {
            m_ping_timer->cancel();
        }
    } else if (op == frame::opcode::CLOSE) {
        m_alog->write(log::alevel::devel,"got close frame");
        // record close code and reason somewhere

        m_remote_close_code = close::extract_code(msg->get_payload(),ec);
        if (ec) {
            s.str("");
            if (config::drop_on_protocol_error) {
                s << "Received invalid close code " << m_remote_close_code
                  << " dropping connection per config.";
                m_elog->write(log::elevel::devel,s.str());
                this->terminate(ec);
            } else {
                s << "Received invalid close code " << m_remote_close_code
                  << " sending acknowledgement and closing";
                m_elog->write(log::elevel::devel,s.str());
                ec = send_close_ack(close::status::protocol_error,
                    "Invalid close code");
                if (ec) {
                    log_err(log::elevel::devel,"send_close_ack",ec);
                }
            }
            return;
        }

        m_remote_close_reason = close::extract_reason(msg->get_payload(),ec);
        if (ec) {
            if (config::drop_on_protocol_error) {
                m_elog->write(log::elevel::devel,
                    "Received invalid close reason. Dropping connection per config");
                this->terminate(ec);
            } else {
                m_elog->write(log::elevel::devel,
                    "Received invalid close reason. Sending acknowledgement and closing");
                ec = send_close_ack(close::status::protocol_error,
                    "Invalid close reason");
                if (ec) {
                    log_err(log::elevel::devel,"send_close_ack",ec);
                }
            }
            return;
        }

        if (m_state == session::state::open) {
            s.str("");
            s << "Received close frame with code " << m_remote_close_code
              << " and reason " << m_remote_close_reason;
            m_alog->write(log::alevel::devel,s.str());

            ec = send_close_ack();
            if (ec) {
                log_err(log::elevel::devel,"send_close_ack",ec);
            }
        } else if (m_state == session::state::closing && !m_was_clean) {
            // ack of our close
            m_alog->write(log::alevel::devel, "Got acknowledgement of close");

            m_was_clean = true;

            // If we are a server terminate the connection now. Clients should
            // leave the connection open to give the server an opportunity to
            // initiate the TCP close. The client's timer will handle closing
            // its side of the connection if the server misbehaves.
            //
            // TODO: different behavior if the underlying transport doesn't
            // support timers?
            if (m_is_server) {
                terminate(lib::error_code());
            }
        } else {
            // spurious, ignore
            m_elog->write(log::elevel::devel, "Got close frame in wrong state");
        }
    } else {
        // got an invalid control opcode
        m_elog->write(log::elevel::devel, "Got control frame with invalid opcode");
        // initiate protocol error shutdown
    }
}